

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O2

AssertionKind slang::ast::SemanticFacts::getAssertKind(SyntaxKind kind)

{
  AssertionKind AVar1;
  
  if (kind == AssertPropertyStatement) {
    return Assert;
  }
  if (kind == AssumePropertyStatement) {
LAB_00300d80:
    AVar1 = Assume;
  }
  else {
    if (kind != CoverPropertyStatement) {
      if (kind == CoverSequenceStatement) {
        return CoverSequence;
      }
      if (kind == ExpectPropertyStatement) {
        return Expect;
      }
      if (kind == ImmediateAssertStatement) {
        return Assert;
      }
      if (kind == RestrictPropertyStatement) {
        return Restrict;
      }
      if (kind != ImmediateCoverStatement) goto LAB_00300d80;
    }
    AVar1 = CoverProperty;
  }
  return AVar1;
}

Assistant:

AssertionKind SemanticFacts::getAssertKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ImmediateAssertStatement: return AssertionKind::Assert;
        case SyntaxKind::ImmediateAssumeStatement: return AssertionKind::Assume;
        case SyntaxKind::ImmediateCoverStatement: return AssertionKind::CoverProperty;
        case SyntaxKind::AssertPropertyStatement: return AssertionKind::Assert;
        case SyntaxKind::AssumePropertyStatement: return AssertionKind::Assume;
        case SyntaxKind::CoverPropertyStatement: return AssertionKind::CoverProperty;
        case SyntaxKind::CoverSequenceStatement: return AssertionKind::CoverSequence;
        case SyntaxKind::ExpectPropertyStatement: return AssertionKind::Expect;
        case SyntaxKind::RestrictPropertyStatement: return AssertionKind::Restrict;
        default: SLANG_UNREACHABLE;
    }
}